

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O0

Vec_Wec_t * Json_Read(char *pFileName,Abc_Nam_t **ppStrs)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  Vec_Int_t *pVVar3;
  FILE *pFile;
  int iToken;
  int RetValue;
  int nFileSize;
  char *pNext2;
  char *pCur2;
  char *pNext;
  char *pCur;
  char *pContents;
  Vec_Int_t *vTemp;
  Vec_Int_t *vStack;
  Vec_Wec_t *vObjs;
  Abc_Nam_t *pStrs;
  Abc_Nam_t **ppStrs_local;
  char *pFileName_local;
  
  pStrs = (Abc_Nam_t *)ppStrs;
  ppStrs_local = (Abc_Nam_t **)pFileName;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",ppStrs_local);
    pFileName_local = (char *)0x0;
  }
  else {
    iVar1 = Extra_FileSize((char *)ppStrs_local);
    pNext = (char *)malloc((long)(iVar1 + 1));
    pCur = pNext;
    fread(pNext,(long)iVar1,1,__stream);
    pCur[iVar1] = '\0';
    fclose(__stream);
    pNext = pCur;
    pCur = Json_ReadPreprocess(pCur,iVar1);
    sVar2 = strlen(pCur);
    if (pNext != (char *)0x0) {
      free(pNext);
    }
    pNext = pCur;
    vStack = (Vec_Int_t *)Vec_WecAlloc(1000);
    vTemp = Vec_IntAlloc(100);
    vObjs = (Vec_Wec_t *)Abc_NamStart(1000,0x18);
    iVar1 = Vec_WecSize((Vec_Wec_t *)vStack);
    if (iVar1 != 0) {
      __assert_fail("Vec_WecSize(vObjs) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioJson.c"
                    ,0x155,"Vec_Wec_t *Json_Read(char *, Abc_Nam_t **)");
    }
    iVar1 = Vec_IntSize(vTemp);
    if (iVar1 != 0) {
      __assert_fail("Vec_IntSize(vStack) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioJson.c"
                    ,0x156,"Vec_Wec_t *Json_Read(char *, Abc_Nam_t **)");
    }
    while ((pNext < pCur + (int)sVar2 && (pNext = Json_SkipSpaces(pNext), *pNext != '\0'))) {
      pCur2 = Json_SkipNonSpaces(pNext);
      if ((*pNext == '{') || (*pNext == '[')) {
        iVar1 = Vec_IntSize(vTemp);
        pVVar3 = vStack;
        if (0 < iVar1) {
          iVar1 = Vec_IntEntryLast(vTemp);
          pVVar3 = Vec_WecEntry((Vec_Wec_t *)pVVar3,iVar1);
          iVar1 = Vec_WecSize((Vec_Wec_t *)vStack);
          iVar1 = Abc_Var2Lit(iVar1,0);
          Vec_IntPush(pVVar3,iVar1);
        }
        pVVar3 = vTemp;
        iVar1 = Vec_WecSize((Vec_Wec_t *)vStack);
        Vec_IntPush(pVVar3,iVar1);
        pContents = (char *)Vec_WecPushLevel((Vec_Wec_t *)vStack);
        Vec_IntGrow((Vec_Int_t *)pContents,4);
        Vec_IntPush((Vec_Int_t *)pContents,(uint)(*pNext == '['));
        pNext = pNext + 1;
      }
      else if ((*pNext == '}') || (*pNext == ']')) {
        Vec_IntPop(vTemp);
        pNext = pNext + 1;
      }
      else if ((*pNext == ',') || (*pNext == ':')) {
        pNext = pNext + 1;
      }
      else {
        pFile._4_4_ = Json_TokenCompare(pNext,pCur2,&pNext2,(char **)&RetValue);
        if (pFile._4_4_ == 0) {
          pFile._4_4_ = Abc_NamStrFindOrAddLim((Abc_Nam_t *)vObjs,pNext2,_RetValue,(int *)0x0);
        }
        pVVar3 = vStack;
        iVar1 = Vec_IntEntryLast(vTemp);
        pVVar3 = Vec_WecEntry((Vec_Wec_t *)pVVar3,iVar1);
        iVar1 = Abc_Var2Lit(pFile._4_4_,1);
        Vec_IntPush(pVVar3,iVar1);
        pNext = pCur2;
      }
    }
    Vec_IntFree(vTemp);
    if (pCur != (char *)0x0) {
      free(pCur);
    }
    *(Vec_Wec_t **)pStrs = vObjs;
    pFileName_local = (char *)vStack;
  }
  return (Vec_Wec_t *)pFileName_local;
}

Assistant:

Vec_Wec_t * Json_Read( char * pFileName, Abc_Nam_t ** ppStrs )
{
    Abc_Nam_t * pStrs; 
    Vec_Wec_t * vObjs; 
    Vec_Int_t * vStack, * vTemp;
    char * pContents, * pCur, * pNext, * pCur2, * pNext2;
    int nFileSize, RetValue, iToken;
    FILE * pFile;

    // read the file into the buffer
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    nFileSize = Extra_FileSize( pFileName );
    pContents = pCur = ABC_ALLOC( char, nFileSize+1 );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    pContents[nFileSize] = 0;
    fclose( pFile );

    pContents = Json_ReadPreprocess( pCur = pContents, nFileSize );
    nFileSize = strlen(pContents);
    ABC_FREE( pCur );
    pCur = pContents;

    // start data-structures
    vObjs  = Vec_WecAlloc( 1000 );
    vStack = Vec_IntAlloc( 100 );
    pStrs  = Abc_NamStart( 1000, 24 );
    //Json_AddTypes( pStrs );

    // read lines
    assert( Vec_WecSize(vObjs) == 0 );
    assert( Vec_IntSize(vStack) == 0 );
    while ( pCur < pContents + nFileSize )
    {
        pCur  = Json_SkipSpaces( pCur );
        if ( *pCur == '\0' )
            break;
        pNext = Json_SkipNonSpaces( pCur );
        if ( *pCur == '{' || *pCur == '[' )
        {
            // add fanin to node on the previous level
            if ( Vec_IntSize(vStack) > 0 )
                Vec_IntPush( Vec_WecEntry(vObjs, Vec_IntEntryLast(vStack)), Abc_Var2Lit(Vec_WecSize(vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( vStack, Vec_WecSize(vObjs) );
            vTemp = Vec_WecPushLevel( vObjs );
            Vec_IntGrow( vTemp, 4 );
            // remember it as an array
            Vec_IntPush( vTemp, (int)(*pCur == '[') );
            pCur++;
            continue;
        }
        if ( *pCur == '}' || *pCur == ']' )
        {
            Vec_IntPop( vStack );
            pCur++;
            continue;
        }
        if ( *pCur == ',' || *pCur == ':' )
        {
            pCur++;
            continue;
        }
        iToken = Json_TokenCompare( pCur, pNext, &pCur2, &pNext2 );
        if ( iToken == 0 )
            iToken = Abc_NamStrFindOrAddLim( pStrs, pCur2, pNext2, NULL );
        Vec_IntPush( Vec_WecEntry(vObjs, Vec_IntEntryLast(vStack)), Abc_Var2Lit(iToken, 1) );
        pCur = pNext;
    }
    Vec_IntFree( vStack );
    ABC_FREE( pContents );
    *ppStrs = pStrs;
    return vObjs;
}